

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<unsigned_long,unsigned_long,duckdb::GreaterThanEquals,false,false>
                (unsigned_long *ldata,unsigned_long *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  ulong uVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  ulong uVar5;
  sel_t *psVar6;
  idx_t iVar7;
  sel_t sVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  unsigned_long uVar15;
  ulong uVar16;
  
  uVar1 = count + 0x3f;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (uVar1 < 0x40) {
        lVar10 = 0;
      }
      else {
        puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        lVar10 = 0;
        uVar12 = 0;
        uVar16 = 0;
        do {
          if (puVar2 == (unsigned_long *)0x0) {
            uVar15 = 0xffffffffffffffff;
          }
          else {
            uVar15 = puVar2[uVar12];
          }
          uVar9 = uVar16 + 0x40;
          if (count <= uVar16 + 0x40) {
            uVar9 = count;
          }
          uVar13 = uVar16;
          if (uVar15 == 0xffffffffffffffff) {
            if (uVar16 < uVar9) {
              psVar3 = sel->sel_vector;
              psVar4 = false_sel->sel_vector;
              do {
                uVar13 = uVar16;
                if (psVar3 != (sel_t *)0x0) {
                  uVar13 = (ulong)psVar3[uVar16];
                }
                uVar14 = ldata[uVar16];
                uVar5 = rdata[uVar16];
                psVar4[lVar10] = (sel_t)uVar13;
                lVar10 = lVar10 + (ulong)(uVar14 < uVar5);
                uVar16 = uVar16 + 1;
                uVar13 = uVar16;
              } while (uVar9 != uVar16);
            }
          }
          else if (uVar15 == 0) {
            uVar13 = uVar9;
            if (uVar16 < uVar9) {
              psVar3 = sel->sel_vector;
              psVar4 = false_sel->sel_vector;
              do {
                sVar8 = (sel_t)uVar16;
                if (psVar3 != (sel_t *)0x0) {
                  sVar8 = psVar3[uVar16];
                }
                psVar4[lVar10] = sVar8;
                lVar10 = lVar10 + 1;
                uVar16 = uVar16 + 1;
              } while (uVar9 != uVar16);
            }
          }
          else if (uVar16 < uVar9) {
            psVar3 = sel->sel_vector;
            psVar4 = false_sel->sel_vector;
            uVar13 = 0;
            do {
              if (psVar3 == (sel_t *)0x0) {
                sVar8 = (int)uVar16 + (int)uVar13;
              }
              else {
                sVar8 = psVar3[uVar16 + uVar13];
              }
              if ((uVar15 >> (uVar13 & 0x3f) & 1) == 0) {
                uVar14 = 1;
              }
              else {
                uVar14 = (ulong)(ldata[uVar16 + uVar13] < rdata[uVar16 + uVar13]);
              }
              psVar4[lVar10] = sVar8;
              lVar10 = lVar10 + uVar14;
              uVar13 = uVar13 + 1;
            } while ((uVar16 - uVar9) + uVar13 != 0);
            uVar13 = uVar16 + uVar13;
          }
          uVar12 = uVar12 + 1;
          uVar16 = uVar13;
        } while (uVar12 != uVar1 >> 6);
      }
      return count - lVar10;
    }
    if (0x3f < uVar1) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar7 = 0;
      uVar12 = 0;
      uVar16 = 0;
      do {
        if (puVar2 == (unsigned_long *)0x0) {
          uVar15 = 0xffffffffffffffff;
        }
        else {
          uVar15 = puVar2[uVar12];
        }
        uVar9 = uVar16 + 0x40;
        if (count <= uVar16 + 0x40) {
          uVar9 = count;
        }
        uVar13 = uVar9;
        if (uVar15 != 0) {
          uVar13 = uVar16;
          if (uVar15 == 0xffffffffffffffff) {
            if (uVar16 < uVar9) {
              psVar3 = sel->sel_vector;
              psVar4 = true_sel->sel_vector;
              do {
                uVar16 = uVar13;
                if (psVar3 != (sel_t *)0x0) {
                  uVar16 = (ulong)psVar3[uVar13];
                }
                uVar14 = ldata[uVar13];
                uVar5 = rdata[uVar13];
                psVar4[iVar7] = (sel_t)uVar16;
                iVar7 = (iVar7 + 1) - (ulong)(uVar14 < uVar5);
                uVar13 = uVar13 + 1;
              } while (uVar9 != uVar13);
            }
          }
          else if (uVar16 < uVar9) {
            psVar3 = sel->sel_vector;
            psVar4 = true_sel->sel_vector;
            uVar13 = 0;
            do {
              if (psVar3 == (sel_t *)0x0) {
                sVar8 = (int)uVar16 + (int)uVar13;
              }
              else {
                sVar8 = psVar3[uVar16 + uVar13];
              }
              if ((uVar15 >> (uVar13 & 0x3f) & 1) == 0) {
                uVar14 = 0;
              }
              else {
                uVar14 = (ulong)(rdata[uVar16 + uVar13] <= ldata[uVar16 + uVar13]);
              }
              psVar4[iVar7] = sVar8;
              iVar7 = iVar7 + uVar14;
              uVar13 = uVar13 + 1;
            } while ((uVar16 - uVar9) + uVar13 != 0);
            uVar13 = uVar16 + uVar13;
          }
        }
        uVar12 = uVar12 + 1;
        uVar16 = uVar13;
      } while (uVar12 != uVar1 >> 6);
      return iVar7;
    }
  }
  else if (0x3f < uVar1) {
    puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar7 = 0;
    lVar10 = 0;
    uVar12 = 0;
    uVar16 = 0;
    do {
      if (puVar2 == (unsigned_long *)0x0) {
        uVar15 = 0xffffffffffffffff;
      }
      else {
        uVar15 = puVar2[uVar12];
      }
      uVar9 = uVar16 + 0x40;
      if (count <= uVar16 + 0x40) {
        uVar9 = count;
      }
      uVar13 = uVar16;
      if (uVar15 == 0xffffffffffffffff) {
        if (uVar16 < uVar9) {
          psVar3 = sel->sel_vector;
          psVar4 = true_sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          do {
            uVar13 = uVar16;
            if (psVar3 != (sel_t *)0x0) {
              uVar13 = (ulong)psVar3[uVar16];
            }
            uVar14 = rdata[uVar16];
            uVar5 = ldata[uVar16];
            psVar4[iVar7] = (sel_t)uVar13;
            iVar7 = iVar7 + (uVar14 <= uVar5);
            psVar6[lVar10] = (sel_t)uVar13;
            lVar10 = lVar10 + (ulong)(uVar5 < uVar14);
            uVar16 = uVar16 + 1;
            uVar13 = uVar16;
          } while (uVar9 != uVar16);
        }
      }
      else if (uVar15 == 0) {
        uVar13 = uVar9;
        if (uVar16 < uVar9) {
          psVar3 = sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          do {
            uVar14 = uVar16;
            if (psVar3 != (sel_t *)0x0) {
              uVar14 = (ulong)psVar3[uVar16];
            }
            psVar4[lVar10] = (sel_t)uVar14;
            lVar10 = lVar10 + 1;
            uVar16 = uVar16 + 1;
          } while (uVar9 != uVar16);
        }
      }
      else if (uVar16 < uVar9) {
        psVar3 = sel->sel_vector;
        psVar4 = true_sel->sel_vector;
        psVar6 = false_sel->sel_vector;
        uVar13 = 0;
        do {
          if (psVar3 == (sel_t *)0x0) {
            sVar8 = (int)uVar16 + (int)uVar13;
          }
          else {
            sVar8 = psVar3[uVar16 + uVar13];
          }
          if ((uVar15 >> (uVar13 & 0x3f) & 1) == 0) {
            bVar11 = false;
          }
          else {
            bVar11 = rdata[uVar16 + uVar13] <= ldata[uVar16 + uVar13];
          }
          psVar4[iVar7] = sVar8;
          iVar7 = iVar7 + bVar11;
          psVar6[lVar10] = sVar8;
          lVar10 = lVar10 + (ulong)(bVar11 ^ 1);
          uVar13 = uVar13 + 1;
        } while ((uVar16 - uVar9) + uVar13 != 0);
        uVar13 = uVar16 + uVar13;
      }
      uVar12 = uVar12 + 1;
      uVar16 = uVar13;
    } while (uVar12 != uVar1 >> 6);
    return iVar7;
  }
  return 0;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}